

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O2

void __thiscall Assimp::XGLImporter::ReadWorld(XGLImporter *this,TempScope *scope)

{
  bool bVar1;
  aiNode *this_00;
  string local_50;
  
  do {
    bVar1 = ReadElementUpToClosing(this,"world");
    if (!bVar1) {
LAB_0050c561:
      this_00 = ReadObject(this,scope,true,"world");
      if ((this_00->mName).length == 0) {
        aiString::Set(&this_00->mName,"WORLD");
      }
      this->m_scene->mRootNode = this_00;
      return;
    }
    GetElementName_abi_cxx11_(&local_50,this);
    bVar1 = std::operator==(&local_50,"lighting");
    if (!bVar1) {
      bVar1 = std::operator==(&local_50,"object");
      if (!bVar1) {
        bVar1 = std::operator==(&local_50,"mesh");
        if (!bVar1) {
          bVar1 = std::operator==(&local_50,"mat");
          if (!bVar1) goto LAB_0050c54d;
        }
      }
      std::__cxx11::string::~string((string *)&local_50);
      goto LAB_0050c561;
    }
    ReadLighting(this,scope);
LAB_0050c54d:
    std::__cxx11::string::~string((string *)&local_50);
  } while( true );
}

Assistant:

void XGLImporter::ReadWorld(TempScope& scope)
{
    while (ReadElementUpToClosing("world")) {
        const std::string& s = GetElementName();
        // XXX right now we'd skip <lighting> if it comes after
        // <object> or <mesh>
        if (s == "lighting") {
            ReadLighting(scope);
        }
        else if (s == "object" || s == "mesh" || s == "mat") {
            break;
        }
    }


    aiNode* const nd = ReadObject(scope,true,"world");
    if(!nd) {
        ThrowException("failure reading <world>");
    }
    if(!nd->mName.length) {
        nd->mName.Set("WORLD");
    }

    m_scene->mRootNode = nd;
}